

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v10::basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::move
          (basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *this,
          basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *other)

{
  uint *puVar1;
  uint *puVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  puVar2 = (other->super_buffer<unsigned_int>).ptr_;
  uVar5 = (other->super_buffer<unsigned_int>).size_;
  uVar3 = (other->super_buffer<unsigned_int>).capacity_;
  puVar1 = other->store_;
  if (puVar2 == puVar1) {
    (this->super_buffer<unsigned_int>).ptr_ = this->store_;
    (this->super_buffer<unsigned_int>).capacity_ = uVar3;
    if (uVar5 != 0) {
      lVar4 = 0;
      do {
        *(undefined4 *)((long)this->store_ + lVar4) = *(undefined4 *)((long)puVar1 + lVar4);
        lVar4 = lVar4 + 4;
      } while (uVar5 * 4 - lVar4 != 0);
    }
  }
  else {
    (this->super_buffer<unsigned_int>).ptr_ = puVar2;
    (this->super_buffer<unsigned_int>).capacity_ = uVar3;
    (other->super_buffer<unsigned_int>).ptr_ = puVar1;
    (other->super_buffer<unsigned_int>).size_ = 0;
    (other->super_buffer<unsigned_int>).capacity_ = 0;
    uVar3 = (this->super_buffer<unsigned_int>).capacity_;
  }
  if (uVar3 < uVar5) {
    (**(this->super_buffer<unsigned_int>)._vptr_buffer)(this,uVar5);
    uVar3 = (this->super_buffer<unsigned_int>).capacity_;
  }
  if (uVar3 < uVar5) {
    uVar5 = uVar3;
  }
  (this->super_buffer<unsigned_int>).size_ = uVar5;
  return;
}

Assistant:

FMT_CONSTEXPR20 void move(basic_memory_buffer& other) {
    alloc_ = std::move(other.alloc_);
    T* data = other.data();
    size_t size = other.size(), capacity = other.capacity();
    if (data == other.store_) {
      this->set(store_, capacity);
      detail::copy_str<T>(other.store_, other.store_ + size, store_);
    } else {
      this->set(data, capacity);
      // Set pointer to the inline array so that delete is not called
      // when deallocating.
      other.set(other.store_, 0);
      other.clear();
    }
    this->resize(size);
  }